

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_pool_impl.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::file_pool_impl<libtorrent::aux::file_pool_entry>::close_oldest
          (file_pool_impl<libtorrent::aux::file_pool_entry> *this)

{
  FileHandle deferred_destruction;
  unique_lock<std::mutex> l;
  __shared_ptr<libtorrent::aux::file_handle,_(__gnu_cxx::_Lock_policy)2> local_38;
  unique_lock<std::mutex> local_28;
  
  local_38._M_ptr = (element_type *)0x0;
  local_38._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ::std::unique_lock<std::mutex>::unique_lock(&local_28,&this->m_mutex);
  remove_oldest((file_pool_impl<libtorrent::aux::file_pool_entry> *)&stack0xffffffffffffffe8,
                (unique_lock<std::mutex> *)this);
  ::std::__shared_ptr<libtorrent::aux::file_handle,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&local_38,
             (__shared_ptr<libtorrent::aux::file_handle,_(__gnu_cxx::_Lock_policy)2> *)
             &stack0xffffffffffffffe8);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xfffffffffffffff0);
  ::std::unique_lock<std::mutex>::~unique_lock(&local_28);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  return;
}

Assistant:

void file_pool_impl<FileEntry>::close_oldest()
	{
		// closing a file may be long running operation (mac os x)
		// destruct it after the mutex is released
		FileHandle deferred_destruction;

		std::unique_lock<std::mutex> l(m_mutex);
		deferred_destruction = remove_oldest(l);
	}